

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void mi_printf_amount(int64_t n,int64_t unit,mi_output_fun *out,void *arg,char *fmt)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  char buf [32];
  char unitdesc [8];
  
  buf[0] = '\0';
  pcVar10 = "B";
  if (unit < 1) {
    pcVar10 = " ";
  }
  uVar2 = 0x400;
  if (unit == 0) {
    uVar2 = 1000;
  }
  uVar5 = -n;
  if (0 < n) {
    uVar5 = n;
  }
  if (uVar5 < uVar2) {
    if ((n != 1) || (*pcVar10 != 'B')) {
      if (n == 0) {
        pcVar10 = "";
      }
      _mi_snprintf(buf,0x20,"%lld   %-3s",n,pcVar10);
    }
  }
  else {
    uVar7 = 0x100000;
    if (unit == 0) {
      uVar7 = 1000000;
    }
    pcVar10 = "i";
    if (unit == 0) {
      pcVar10 = "";
    }
    pcVar8 = "M";
    if (uVar5 < uVar7) {
      pcVar8 = "K";
      uVar7 = uVar2;
    }
    uVar3 = uVar2 * uVar7;
    pcVar1 = "G";
    if (uVar5 < uVar2 * uVar7) {
      uVar3 = uVar7;
      pcVar1 = pcVar8;
    }
    lVar4 = n / (long)(uVar3 / 10);
    lVar6 = lVar4 % 10;
    _mi_snprintf(unitdesc,8,"%s%s%s",pcVar1,pcVar10);
    lVar9 = -lVar6;
    if (0 < lVar6) {
      lVar9 = lVar6;
    }
    _mi_snprintf(buf,0x20,"%ld.%ld %-3s",lVar4 / 10,lVar9,unitdesc);
  }
  pcVar10 = "%12s";
  if (arg != (void *)0x0) {
    pcVar10 = (char *)arg;
  }
  _mi_fprintf(mi_buffered_out,out,pcVar10,buf);
  return;
}

Assistant:

static void mi_printf_amount(int64_t n, int64_t unit, mi_output_fun* out, void* arg, const char* fmt) {
  char buf[32]; buf[0] = 0;
  int  len = 32;
  const char* suffix = (unit <= 0 ? " " : "B");
  const int64_t base = (unit == 0 ? 1000 : 1024);
  if (unit>0) n *= unit;

  const int64_t pos = (n < 0 ? -n : n);
  if (pos < base) {
    if (n!=1 || suffix[0] != 'B') {  // skip printing 1 B for the unit column
      _mi_snprintf(buf, len, "%lld   %-3s", (long long)n, (n==0 ? "" : suffix));
    }
  }
  else {
    int64_t divider = base;
    const char* magnitude = "K";
    if (pos >= divider*base) { divider *= base; magnitude = "M"; }
    if (pos >= divider*base) { divider *= base; magnitude = "G"; }
    const int64_t tens = (n / (divider/10));
    const long whole = (long)(tens/10);
    const long frac1 = (long)(tens%10);
    char unitdesc[8];
    _mi_snprintf(unitdesc, 8, "%s%s%s", magnitude, (base==1024 ? "i" : ""), suffix);
    _mi_snprintf(buf, len, "%ld.%ld %-3s", whole, (frac1 < 0 ? -frac1 : frac1), unitdesc);
  }
  _mi_fprintf(out, arg, (fmt==NULL ? "%12s" : fmt), buf);
}